

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnSegment::MarkAsPersistent
          (ColumnSegment *this,shared_ptr<duckdb::BlockHandle,_true> *block_p,uint32_t offset_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  BlockHandle *pBVar3;
  
  this->segment_type = PERSISTENT;
  pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(block_p);
  this->block_id = pBVar3->block_id;
  this->offset = (ulong)offset_p;
  peVar1 = (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (block_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void ColumnSegment::MarkAsPersistent(shared_ptr<BlockHandle> block_p, uint32_t offset_p) {
	D_ASSERT(segment_type == ColumnSegmentType::TRANSIENT);
	segment_type = ColumnSegmentType::PERSISTENT;

	block_id = block_p->BlockId();
	offset = offset_p;
	block = std::move(block_p);
}